

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall maths::Matrix::Matrix(Matrix *this,Matrix *m)

{
  int *in_RSI;
  Matrix *in_RDI;
  int j;
  int i;
  int local_18;
  int local_14;
  
  in_RDI->rows_ = *in_RSI;
  in_RDI->cols_ = in_RSI[1];
  allocSpace(in_RDI);
  for (local_14 = 0; local_14 < in_RDI->rows_; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RDI->cols_; local_18 = local_18 + 1) {
      in_RDI->p[local_14][local_18] =
           *(double *)(*(long *)(*(long *)(in_RSI + 2) + (long)local_14 * 8) + (long)local_18 * 8);
    }
  }
  return;
}

Assistant:

Matrix::Matrix(const Matrix& m) : rows_(m.rows_), cols_(m.cols_)
{
    allocSpace();
    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = m.p[i][j];
        }
    }
}